

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

bool __thiscall
CTypeCheckerVisitor::checkCyclicInheritance
          (CTypeCheckerVisitor *this,shared_ptr<ClassInfo> *startClass,
          shared_ptr<ClassInfo> *currentClass)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  element_type *__rhs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
  *this_00;
  mapped_type *pmVar4;
  shared_ptr<ClassInfo> local_48;
  shared_ptr<ClassInfo> local_38;
  shared_ptr<ClassInfo> *local_28;
  shared_ptr<ClassInfo> *currentClass_local;
  shared_ptr<ClassInfo> *startClass_local;
  CTypeCheckerVisitor *this_local;
  
  local_28 = currentClass;
  currentClass_local = startClass;
  startClass_local = (shared_ptr<ClassInfo> *)this;
  peVar3 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      currentClass);
  bVar1 = std::operator==(&peVar3->baseClass,"");
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    peVar3 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        currentClass);
    __rhs = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       startClass);
    _Var2 = std::operator==(&peVar3->baseClass,&__rhs->name);
    if (_Var2) {
      this_local._7_1_ = 1;
    }
    else {
      std::shared_ptr<ClassInfo>::shared_ptr(&local_38,startClass);
      this_00 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->table)->classes;
      peVar3 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)currentClass);
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
               ::operator[](this_00,&peVar3->baseClass);
      std::shared_ptr<ClassInfo>::shared_ptr(&local_48,pmVar4);
      this_local._7_1_ = checkCyclicInheritance(this,&local_38,&local_48);
      std::shared_ptr<ClassInfo>::~shared_ptr(&local_48);
      std::shared_ptr<ClassInfo>::~shared_ptr(&local_38);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CTypeCheckerVisitor::checkCyclicInheritance(std::shared_ptr<ClassInfo> startClass,
                                                 std::shared_ptr<ClassInfo> currentClass) {
    if( currentClass->baseClass == "" ) {
        return false;
    }
    if( currentClass->baseClass == startClass->name )
    {
        return true;
    }
    return checkCyclicInheritance( startClass, table->classes[currentClass->baseClass]);
}